

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void flush_pending(z_streamp strm)

{
  uint local_14;
  uint len;
  z_streamp strm_local;
  
  local_14 = strm->state->pending;
  if (strm->avail_out < local_14) {
    local_14 = strm->avail_out;
  }
  if (local_14 != 0) {
    memcpy(strm->next_out,strm->state->pending_out,(ulong)local_14);
    strm->next_out = strm->next_out + local_14;
    strm->state->pending_out = strm->state->pending_out + local_14;
    strm->total_out = (ulong)local_14 + strm->total_out;
    strm->avail_out = strm->avail_out - local_14;
    strm->state->pending = strm->state->pending - local_14;
    if (strm->state->pending == 0) {
      strm->state->pending_out = strm->state->pending_buf;
    }
  }
  return;
}

Assistant:

local void flush_pending(strm)
    z_streamp strm;
{
    unsigned len = strm->state->pending;

    if (len > strm->avail_out) len = strm->avail_out;
    if (len == 0) return;

    zmemcpy(strm->next_out, strm->state->pending_out, len);
    strm->next_out  += len;
    strm->state->pending_out  += len;
    strm->total_out += len;
    strm->avail_out  -= len;
    strm->state->pending -= len;
    if (strm->state->pending == 0) {
        strm->state->pending_out = strm->state->pending_buf;
    }
}